

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O3

char * __thiscall xray_re::xr_ini_file::r_string(xr_ini_file *this,char *sname,char *lname)

{
  pointer ppiVar1;
  ini_item *piVar2;
  ulong uVar3;
  int iVar4;
  ini_section *piVar5;
  ulong uVar6;
  pointer ppiVar7;
  
  piVar5 = r_section(this,sname);
  ppiVar7 = (piVar5->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppiVar1 = (piVar5->items).
            super__Vector_base<xray_re::xr_ini_file::ini_item_*,_std::allocator<xray_re::xr_ini_file::ini_item_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)ppiVar1 - (long)ppiVar7 >> 3;
  while (uVar3 = uVar6, 0 < (long)uVar3) {
    uVar6 = uVar3 >> 1;
    iVar4 = strcasecmp((ppiVar7[uVar6]->name)._M_dataplus._M_p,lname);
    if (iVar4 < 0) {
      ppiVar7 = ppiVar7 + uVar6 + 1;
      uVar6 = ~uVar6 + uVar3;
    }
  }
  if (ppiVar7 != ppiVar1) {
    piVar2 = *ppiVar7;
    iVar4 = strcasecmp((piVar2->name)._M_dataplus._M_p,lname);
    if (iVar4 == 0) {
      return (piVar2->value)._M_dataplus._M_p;
    }
  }
  msg("can\'t find item %s in section %s",lname,sname);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ini_file.cxx"
                ,0x62,"const char *xray_re::xr_ini_file::r_string(const char *, const char *) const"
               );
}

Assistant:

const char* xr_ini_file::r_string(const char* sname, const char* lname) const
{
	const ini_section* section = r_section(sname);
	ini_item_vec_cit it = lower_bound_if(section->begin(), section->end(), ini_item_pred(lname));
	if (it == section->end() || xr_stricmp((*it)->name.c_str(), lname) != 0) {
		msg("can't find item %s in section %s", lname, sname);
		xr_not_expected();
	}
	return (*it)->value.c_str();
}